

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O3

void botpOCRAStepR(char *otp,octet *q,size_t q_len,tm_time_t t,void *state)

{
  void *dest;
  size_t sVar1;
  size_t count;
  
  dest = (void *)((long)state + 0x33a);
  sVar1 = beltHMAC_keep();
  count = beltHMAC_keep();
  memCopy(dest,(void *)((long)state + sVar1 + 0x33a),count);
  if (*(long *)((long)state + 0x18) != 0) {
    beltHMACStepA((octet *)((long)state + 8),8,dest);
    botpCtrNext((octet *)((long)state + 8));
  }
  memMove((void *)((long)state + 0x20),q,q_len);
  memSet((void *)((long)state + q_len + 0x20),'\0',0x80 - q_len);
  beltHMACStepA((void *)((long)state + 0x20),0x80,dest);
  if (*(size_t *)((long)state + 0xf0) != 0) {
    beltHMACStepA((void *)((long)state + 0xb0),*(size_t *)((long)state + 0xf0),dest);
  }
  if (*(size_t *)((long)state + 0x2f8) != 0) {
    beltHMACStepA((void *)((long)state + 0xf8),*(size_t *)((long)state + 0x2f8),dest);
  }
  if (*(long *)((long)state + 0x308) != 0) {
    botpTimeToCtr((octet *)((long)state + 0x300),t);
    beltHMACStepA((octet *)((long)state + 0x300),8,dest);
  }
  beltHMACStepG((octet *)((long)state + 0x310),dest);
  botpDT(otp,*state,(octet *)((long)state + 0x310),0x20);
  return;
}

Assistant:

void botpOCRAStepR(char* otp, const octet q[], size_t q_len, tm_time_t t, 
	void* state)
{
	botp_ocra_st* st = (botp_ocra_st*)state;
	// pre
	ASSERT(memIsDisjoint2(otp, st->digit + 1, state, botpOCRA_keep()) || 
		otp == st->otp);
	ASSERT(4 <= q_len && q_len <= 2 * st->q_max);
	ASSERT(memIsDisjoint2(q, q_len, state, botpOCRA_keep() || q == st->q));
	ASSERT(t != TIME_ERR);
	// вычислить имитовставку
	memCopy(st->stack, st->stack + beltHMAC_keep(), beltHMAC_keep());
	if (st->ctr_len)
		beltHMACStepA(st->ctr, 8, st->stack), botpCtrNext(st->ctr);
	memMove(st->q, q, q_len);
	memSetZero(st->q + q_len, 128 - q_len);
	beltHMACStepA(st->q, 128, st->stack);
	if (st->p_len)
		beltHMACStepA(st->p, st->p_len, st->stack);
	if (st->s_len)
		beltHMACStepA(st->s, st->s_len, st->stack);
	if (st->ts)
		botpTimeToCtr(st->t, t), beltHMACStepA(st->t, 8, st->stack);
	beltHMACStepG(st->mac, st->stack);
	// построить пароль
	botpDT(otp, st->digit, st->mac, 32);
}